

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::Initialize
          (ChLinkMateGeneric *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpt1,
          ChVector<double> *mpt2,ChVector<double> *mnorm1,ChVector<double> *mnorm2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  element_type *peVar8;
  element_type *peVar9;
  undefined1 auVar10 [16];
  ChVector<double> *pCVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  int iVar14;
  int iVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ChVector<double> mz;
  ChVector<double> my;
  ChVector<double> mx;
  ChVector<double> local_258;
  ChVector<double> *local_238;
  ChVector<double> *local_230;
  ChVector<double> local_228;
  ChVector<double> local_208;
  ChVector<double> local_1e8;
  undefined1 local_1c8 [16];
  double local_1b8;
  ChVector<double> local_1a8;
  ChMatrix33<double> local_188;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  peVar8 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar9 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_238 = mpt2;
  local_230 = mpt1;
  if (peVar8 != peVar9) {
    (this->super_ChLinkMate).super_ChLink.Body1 = peVar8;
    (this->super_ChLinkMate).super_ChLink.Body2 = peVar9;
    iVar14 = (*(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    iVar15 = (*(((this->super_ChLinkMate).super_ChLink.Body2)->super_ChFrameMoving<double>).
               super_ChFrame<double>._vptr_ChFrame[0x10])();
    ChLinkMask::SetTwoBodiesVariables
              (&this->mask,(ChVariables *)CONCAT44(extraout_var,iVar14),
               (ChVariables *)CONCAT44(extraout_var_00,iVar15));
    local_1e8.m_data[2] = 0.0;
    local_208.m_data[2] = 0.0;
    local_228.m_data[2] = 0.0;
    local_258.m_data[2] = 0.0;
    local_140._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    local_140.coord.pos.m_data[2] = 0.0;
    local_1e8.m_data[0] = 0.0;
    local_1e8.m_data[1] = 0.0;
    local_208.m_data[0] = 0.0;
    local_208.m_data[1] = 0.0;
    local_228.m_data[0] = 0.0;
    local_228.m_data[1] = 0.0;
    local_258.m_data[0] = 0.0;
    local_258.m_data[1] = 0.0;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
         ZEXT816(0);
    local_140.coord.pos.m_data[0] = 0.0;
    local_140.coord.pos.m_data[1] = 0.0;
    ChFrame<double>::ChFrame
              (&local_b8,(ChVector<double> *)&local_188,(ChQuaternion<double> *)&local_140);
    auVar12 = (undefined1  [64])
              local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
              _0_64_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    auVar13 = (undefined1  [64])
              local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
              _0_64_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._32_32_ =
         auVar12._32_32_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_24_ =
         auVar13._0_24_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    local_1b8 = 0.0;
    local_1c8 = ZEXT816(0);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_24_ =
         ZEXT824(0x3ff0000000000000);
    ChFrame<double>::ChFrame
              (&local_140,(ChVector<double> *)local_1c8,(ChQuaternion<double> *)&local_188);
    pCVar11 = local_238;
    if (pos_are_relative) {
      if (&local_258 != mnorm1) {
        local_258.m_data[0] = mnorm1->m_data[0];
        local_258.m_data[1] = mnorm1->m_data[1];
        local_258.m_data[2] = mnorm1->m_data[2];
      }
      auVar10 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
           auVar10;
      ChVector<double>::DirToDxDyDz
                (&local_258,&local_1e8,&local_208,&local_228,(ChVector<double> *)&local_188);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_1e8.m_data[2];
      vbroadcastsd_avx512f(auVar1);
      vpermt2pd_avx512f(_DAT_00e82400,ZEXT1664(CONCAT88(local_208.m_data[1],local_208.m_data[0])));
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_208.m_data[2];
      vbroadcastsd_avx512f(auVar2);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_64_ =
           vpermt2pd_avx512f(_DAT_00e82440,
                             ZEXT1664(CONCAT88(local_228.m_data[1],local_228.m_data[0])));
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_228.m_data[2];
      ChFrame<double>::SetRot(&local_b8,&local_188);
      if (&local_b8.coord != (ChCoordsys<double> *)local_230) {
        local_b8.coord.pos.m_data[0] = local_230->m_data[0];
        local_b8.coord.pos.m_data[1] = local_230->m_data[1];
        local_b8.coord.pos.m_data[2] = local_230->m_data[2];
      }
      if (&local_258 != mnorm2) {
        local_258.m_data[0] = mnorm2->m_data[0];
        local_258.m_data[1] = mnorm2->m_data[1];
        local_258.m_data[2] = mnorm2->m_data[2];
      }
      local_1c8 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
      local_1b8 = 0.0;
      ChVector<double>::DirToDxDyDz
                (&local_258,&local_1e8,&local_208,&local_228,(ChVector<double> *)local_1c8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_1e8.m_data[2];
      vbroadcastsd_avx512f(auVar3);
      vpermt2pd_avx512f(_DAT_00e82400,ZEXT1664(CONCAT88(local_208.m_data[1],local_208.m_data[0])));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_208.m_data[2];
      vbroadcastsd_avx512f(auVar4);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_64_ =
           vpermt2pd_avx512f(_DAT_00e82440,
                             ZEXT1664(CONCAT88(local_228.m_data[1],local_228.m_data[0])));
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_228.m_data[2];
      ChFrame<double>::SetRot(&local_140,&local_188);
      if (&local_140.coord != (ChCoordsys<double> *)pCVar11) {
        local_140.coord.pos.m_data[0] = pCVar11->m_data[0];
        local_140.coord.pos.m_data[1] = pCVar11->m_data[1];
        local_140.coord.pos.m_data[2] = pCVar11->m_data[2];
      }
    }
    else {
      local_1c8._8_8_ = DAT_011dd428;
      local_1c8._0_8_ = VECT_Z;
      local_1b8 = DAT_011dd430;
      ChFrame<double>::TransformDirectionParentToLocal
                ((ChVector<double> *)&local_188,
                 (ChFrame<double> *)(this->super_ChLinkMate).super_ChLink.Body1,mnorm1);
      local_258.m_data[0] =
           local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_258.m_data[1] =
           local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_258.m_data[2] =
           local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      ChVector<double>::DirToDxDyDz
                (&local_258,&local_1e8,&local_208,&local_228,(ChVector<double> *)local_1c8);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1e8.m_data[2];
      vbroadcastsd_avx512f(auVar10);
      vpermt2pd_avx512f(_DAT_00e82400,ZEXT1664(CONCAT88(local_208.m_data[1],local_208.m_data[0])));
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_208.m_data[2];
      vbroadcastsd_avx512f(auVar5);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_64_ =
           vpermt2pd_avx512f(_DAT_00e82440,
                             ZEXT1664(CONCAT88(local_228.m_data[1],local_228.m_data[0])));
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_228.m_data[2];
      ChFrame<double>::SetRot(&local_b8,&local_188);
      ChFrame<double>::TransformPointParentToLocal
                (&local_1a8,(ChFrame<double> *)(this->super_ChLinkMate).super_ChLink.Body1,local_230
                );
      local_b8.coord.pos.m_data[0] = local_1a8.m_data[0];
      local_b8.coord.pos.m_data[1] = local_1a8.m_data[1];
      local_b8.coord.pos.m_data[2] = local_1a8.m_data[2];
      ChFrame<double>::TransformDirectionParentToLocal
                (&local_1a8,(ChFrame<double> *)(this->super_ChLinkMate).super_ChLink.Body2,mnorm2);
      local_258.m_data[0] = local_1a8.m_data[0];
      local_258.m_data[1] = local_1a8.m_data[1];
      local_258.m_data[2] = local_1a8.m_data[2];
      ChVector<double>::DirToDxDyDz
                (&local_258,&local_1e8,&local_208,&local_228,(ChVector<double> *)local_1c8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1e8.m_data[2];
      vbroadcastsd_avx512f(auVar6);
      vpermt2pd_avx512f(_DAT_00e82400,ZEXT1664(CONCAT88(local_208.m_data[1],local_208.m_data[0])));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_208.m_data[2];
      vbroadcastsd_avx512f(auVar7);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_64_ =
           vpermt2pd_avx512f(_DAT_00e82440,
                             ZEXT1664(CONCAT88(local_228.m_data[1],local_228.m_data[0])));
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_228.m_data[2];
      ChFrame<double>::SetRot(&local_140,&local_188);
      ChFrame<double>::TransformPointParentToLocal
                (&local_1a8,(ChFrame<double> *)(this->super_ChLinkMate).super_ChLink.Body2,local_238
                );
      local_140.coord.pos.m_data[0] = local_1a8.m_data[0];
      local_140.coord.pos.m_data[1] = local_1a8.m_data[1];
      local_140.coord.pos.m_data[2] = local_1a8.m_data[2];
    }
    ChFrame<double>::operator=(&this->frame1,&local_b8);
    ChFrame<double>::operator=(&this->frame2,&local_140);
    return;
  }
  __assert_fail("mbody1.get() != mbody2.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMate.cpp"
                ,0x108,
                "virtual void chrono::ChLinkMateGeneric::Initialize(std::shared_ptr<ChBodyFrame>, std::shared_ptr<ChBodyFrame>, bool, ChVector<>, ChVector<>, ChVector<>, ChVector<>)"
               );
}

Assistant:

void ChLinkMateGeneric::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                   std::shared_ptr<ChBodyFrame> mbody2,
                                   bool pos_are_relative,
                                   ChVector<> mpt1,
                                   ChVector<> mpt2,
                                   ChVector<> mnorm1,
                                   ChVector<> mnorm2) {
    assert(mbody1.get() != mbody2.get());

    this->Body1 = mbody1.get();
    this->Body2 = mbody2.get();
    // this->SetSystem(mbody1->GetSystem());

    this->mask.SetTwoBodiesVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> mx, my, mz, mN;
    ChMatrix33<> mrot;

    ChFrame<> mfr1;
    ChFrame<> mfr2;

    if (pos_are_relative) {
        mN = mnorm1;
        mN.DirToDxDyDz(mx, my, mz);
        mrot.Set_A_axis(mx, my, mz);
        mfr1.SetRot(mrot);
        mfr1.SetPos(mpt1);

        mN = mnorm2;
        mN.DirToDxDyDz(mx, my, mz);
        mrot.Set_A_axis(mx, my, mz);
        mfr2.SetRot(mrot);
        mfr2.SetPos(mpt2);
    } else {
        ChVector<> temp = VECT_Z;
        // from abs to body-rel
        mN = this->Body1->TransformDirectionParentToLocal(mnorm1);
        mN.DirToDxDyDz(mx, my, mz, temp);
        mrot.Set_A_axis(mx, my, mz);
        mfr1.SetRot(mrot);
        mfr1.SetPos(this->Body1->TransformPointParentToLocal(mpt1));

        mN = this->Body2->TransformDirectionParentToLocal(mnorm2);
        mN.DirToDxDyDz(mx, my, mz, temp);
        mrot.Set_A_axis(mx, my, mz);
        mfr2.SetRot(mrot);
        mfr2.SetPos(this->Body2->TransformPointParentToLocal(mpt2));
    }

    this->frame1 = mfr1;
    this->frame2 = mfr2;
}